

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O2

void __thiscall iqxmlrpc::Parser::Impl::~Impl(Impl *this)

{
  xmlFreeTextReader(this->reader);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Impl()
  {
    xmlFreeTextReader(reader);
  }